

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteFloatArray
               (float *a,int n,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteRaw(output,a,n * 4);
  return;
}

Assistant:

void WireFormatLite::WriteFloatArray(const float* a, int n,
                                     io::CodedOutputStream* output) {
  WriteArray<float>(a, n, output);
}